

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

timediff_t Curl_shutdown_timeleft(connectdata *conn,int sockindex,curltime *nowp)

{
  uint uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  curltime *pcVar4;
  timediff_t tVar5;
  curltime cVar6;
  curltime older;
  connectdata *local_60;
  undefined4 uStack_44;
  timediff_t left_ms;
  curltime now;
  curltime *nowp_local;
  int sockindex_local;
  connectdata *conn_local;
  
  if (((conn->shutdown).start[sockindex].tv_sec == 0) || ((conn->shutdown).timeout_ms == 0)) {
    conn_local = (connectdata *)0x0;
  }
  else {
    now._8_8_ = nowp;
    if (nowp == (curltime *)0x0) {
      cVar6 = Curl_now();
      left_ms = cVar6.tv_sec;
      now.tv_sec = CONCAT44(uStack_44,cVar6.tv_usec);
      now._8_8_ = &left_ms;
    }
    uVar1 = (conn->shutdown).timeout_ms;
    pcVar4 = (conn->shutdown).start + sockindex;
    uVar2 = pcVar4->tv_sec;
    uVar3 = pcVar4->tv_usec;
    older.tv_usec = uVar3;
    older.tv_sec = uVar2;
    cVar6._12_4_ = 0;
    cVar6._0_12_ = *(undefined1 (*) [12])now._8_8_;
    older._12_4_ = 0;
    tVar5 = Curl_timediff(cVar6,older);
    local_60 = (connectdata *)((ulong)uVar1 - tVar5);
    if (local_60 == (connectdata *)0x0) {
      local_60 = (connectdata *)0xffffffffffffffff;
    }
    conn_local = local_60;
  }
  return (timediff_t)conn_local;
}

Assistant:

timediff_t Curl_shutdown_timeleft(struct connectdata *conn, int sockindex,
                                  struct curltime *nowp)
{
  struct curltime now;
  timediff_t left_ms;

  if(!conn->shutdown.start[sockindex].tv_sec || !conn->shutdown.timeout_ms)
    return 0; /* not started or no limits */

  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }
  left_ms = conn->shutdown.timeout_ms -
            Curl_timediff(*nowp, conn->shutdown.start[sockindex]);
  return left_ms ? left_ms : -1;
}